

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O2

void MyDocument::DisplayContents(MyDocument *doc)

{
  bool bVar1;
  ImVec2 local_18;
  
  ImGui::PushID(doc);
  ImGui::Text("Document \"%s\"",doc->Name);
  ImGui::PushStyleColor(0,&doc->Color);
  ImGui::TextWrapped(
                    "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
                    );
  ImGui::PopStyleColor(1);
  local_18.x = 100.0;
  local_18.y = 0.0;
  bVar1 = ImGui::Button("Modify",&local_18);
  if (bVar1) {
    doc->Dirty = true;
  }
  ImGui::SameLine(0.0,-1.0);
  local_18.x = 100.0;
  local_18.y = 0.0;
  bVar1 = ImGui::Button("Save",&local_18);
  if (bVar1) {
    doc->Dirty = false;
  }
  ImGui::ColorEdit3("color",&(doc->Color).x,0);
  ImGui::PopID();
  return;
}

Assistant:

static void DisplayContents(MyDocument* doc)
    {
        ImGui::PushID(doc);
        ImGui::Text("Document \"%s\"", doc->Name);
        ImGui::PushStyleColor(ImGuiCol_Text, doc->Color);
        ImGui::TextWrapped("Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua.");
        ImGui::PopStyleColor();
        if (ImGui::Button("Modify", ImVec2(100, 0)))
            doc->Dirty = true;
        ImGui::SameLine();
        if (ImGui::Button("Save", ImVec2(100, 0)))
            doc->DoSave();
        ImGui::ColorEdit3("color", &doc->Color.x);  // Useful to test drag and drop and hold-dragged-to-open-tab behavior.
        ImGui::PopID();
    }